

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.c
# Opt level: O1

void relink_light_sources(boolean ghostly,level *lev)

{
  boolean bVar1;
  ulong in_RAX;
  monst *pmVar2;
  undefined8 uVar3;
  ls_t *plVar4;
  uint nid;
  undefined8 uStack_38;
  
  plVar4 = lev->lev_lights;
  if (plVar4 != (ls_t *)0x0) {
    uStack_38 = in_RAX;
    do {
      if ((plVar4->flags & 2) != 0) {
        if ((ushort)plVar4->type < 2) {
          if (ghostly == '\0') {
            uStack_38 = CONCAT44(*(uint *)&plVar4->id,(undefined4)uStack_38);
          }
          else {
            bVar1 = lookup_id_mapping(*(uint *)&plVar4->id,(uint *)((long)&uStack_38 + 4));
            if (bVar1 == '\0') {
              impossible("relink_light_sources: no id mapping");
            }
          }
          if (plVar4->type == 0) {
            pmVar2 = (monst *)find_oid(lev,uStack_38._4_4_);
            uVar3 = 0x6f;
          }
          else {
            pmVar2 = find_mid(lev,uStack_38._4_4_,7);
            uVar3 = 0x6d;
          }
          plVar4->id = pmVar2;
          if (pmVar2 == (monst *)0x0) {
            impossible("relink_light_sources: cant find %c_id %d",uVar3,uStack_38 >> 0x20);
          }
        }
        else {
          impossible("relink_light_sources: bad type (%d)");
        }
        *(byte *)&plVar4->flags = (byte)plVar4->flags & 0xfd;
      }
      plVar4 = plVar4->next;
    } while (plVar4 != (ls_t *)0x0);
  }
  return;
}

Assistant:

void relink_light_sources(boolean ghostly, struct level *lev)
{
    char which;
    unsigned nid;
    light_source *ls;

    for (ls = lev->lev_lights; ls; ls = ls->next) {
	if (ls->flags & LSF_NEEDS_FIXUP) {
	    if (ls->type == LS_OBJECT || ls->type == LS_MONSTER) {
		if (ghostly) {
		    if (!lookup_id_mapping((long)ls->id, &nid))
			impossible("relink_light_sources: no id mapping");
		} else
		    nid = (long) ls->id;
		if (ls->type == LS_OBJECT) {
		    which = 'o';
		    ls->id = find_oid(lev, nid);
		} else {
		    which = 'm';
		    ls->id = find_mid(lev, nid, FM_EVERYWHERE);
		}
		if (!ls->id)
		    impossible("relink_light_sources: cant find %c_id %d",
			       which, nid);
	    } else
		impossible("relink_light_sources: bad type (%d)", ls->type);

	    ls->flags &= ~LSF_NEEDS_FIXUP;
	}
    }
}